

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sender.cc
# Opt level: O3

base_learner * sender_setup(options_i *options,vw *all)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  int iVar3;
  sender *s;
  example **ppeVar4;
  learner<sender,_example> *plVar5;
  string host;
  option_group_definition sender_options;
  undefined1 *local_1a8;
  long local_1a0;
  undefined1 local_198 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  string local_168;
  undefined1 *local_148 [2];
  undefined1 local_138 [16];
  string local_128;
  option_group_definition local_108;
  undefined1 local_d0 [112];
  bool local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_188._M_string_length = 0;
  local_188.field_2._M_local_buf[0] = '\0';
  local_1a8 = local_198;
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"Network sending","");
  paVar1 = &local_108.m_name.field_2;
  local_108.m_name._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>((string *)&local_108,local_1a8,local_1a8 + local_1a0);
  local_108.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_1a8 != local_198) {
    operator_delete(local_1a8);
  }
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"sendto","");
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_d0,&local_128,&local_188);
  local_60 = true;
  local_148[0] = local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"send examples to <host>","");
  std::__cxx11::string::_M_assign((string *)(local_d0 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (&local_108,
             (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_d0);
  if (local_148[0] != local_138) {
    operator_delete(local_148[0]);
  }
  local_d0._0_8_ = &PTR__typed_option_002eaff0;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_108);
  local_d0._0_8_ = local_d0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"sendto","");
  iVar3 = (*options->_vptr_options_i[1])(options,local_d0);
  if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
    operator_delete((void *)local_d0._0_8_);
  }
  if ((char)iVar3 == '\0') {
    plVar5 = (learner<sender,_example> *)0x0;
  }
  else {
    s = calloc_or_throw<sender>(1);
    s->sent_index = 0;
    s->received_index = 0;
    s->all = (vw *)0x0;
    s->delay_ring = (example **)0x0;
    s->buf = (io_buf *)0x0;
    *(undefined8 *)&s->sd = 0;
    local_d0._0_8_ = destroy_free<sender>;
    s->sd = -1;
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    local_d0._8_8_ = s;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_168,local_188._M_dataplus._M_p,
               local_188._M_dataplus._M_p + local_188._M_string_length);
    open_sockets(s,&local_168);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p);
    }
    s->all = all;
    ppeVar4 = calloc_or_throw<example*>(all->p->ring_size);
    s->delay_ring = ppeVar4;
    plVar5 = LEARNER::init_learner<sender,example,LEARNER::learner<char,example>>
                       ((free_ptr<sender> *)local_d0,learn,learn,1);
    uVar2 = *(undefined8 *)(plVar5 + 0x18);
    *(undefined8 *)(plVar5 + 0xb8) = uVar2;
    *(undefined8 *)(plVar5 + 0xc0) = *(undefined8 *)(plVar5 + 0x20);
    *(code **)(plVar5 + 200) = finish;
    *(undefined8 *)(plVar5 + 0x58) = uVar2;
    *(code **)(plVar5 + 0x68) = finish_example;
    *(undefined8 *)(plVar5 + 0xa0) = uVar2;
    *(undefined8 *)(plVar5 + 0xa8) = *(undefined8 *)(plVar5 + 0x20);
    *(code **)(plVar5 + 0xb0) = end_examples;
    if ((sender *)local_d0._8_8_ != (sender *)0x0) {
      (*(code *)local_d0._0_8_)((void *)local_d0._8_8_);
    }
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_108.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_108.m_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  return (base_learner *)plVar5;
}

Assistant:

LEARNER::base_learner* sender_setup(options_i& options, vw& all)
{
  string host;

  option_group_definition sender_options("Network sending");
  sender_options.add(make_option("sendto", host).keep().help("send examples to <host>"));
  options.add_and_parse(sender_options);

  if (!options.was_supplied("sendto"))
  {
    return nullptr;
  }

  auto s = scoped_calloc_or_throw<sender>();
  s->sd = -1;
  open_sockets(*s.get(), host);

  s->all = &all;
  s->delay_ring = calloc_or_throw<example*>(all.p->ring_size);

  LEARNER::learner<sender, example>& l = init_learner(s, learn, learn, 1);
  l.set_finish(finish);
  l.set_finish_example(finish_example);
  l.set_end_examples(end_examples);
  return make_base(l);
}